

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O3

MPP_RET mpp_dump_deinit(MppDump *info)

{
  undefined8 *puVar1;
  pthread_mutex_t *__mutex;
  MppDumpImpl *p;
  
  if ((info != (MppDump *)0x0) && (puVar1 = (undefined8 *)*info, puVar1 != (undefined8 *)0x0)) {
    if ((FILE *)puVar1[5] != (FILE *)0x0) {
      fclose((FILE *)puVar1[5]);
    }
    puVar1[5] = 0;
    if ((FILE *)puVar1[6] != (FILE *)0x0) {
      fclose((FILE *)puVar1[6]);
    }
    puVar1[6] = 0;
    if ((FILE *)puVar1[7] != (FILE *)0x0) {
      fclose((FILE *)puVar1[7]);
    }
    puVar1[7] = 0;
    if ((void *)puVar1[8] != (void *)0x0) {
      mpp_osal_free("mpp_dump_deinit",(void *)puVar1[8]);
    }
    puVar1[8] = 0;
    __mutex = (pthread_mutex_t *)*puVar1;
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_destroy(__mutex);
      operator_delete(__mutex,0x28);
      *puVar1 = 0;
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dump_deinit(MppDump *info)
{
    if (info && *info) {
        MppDumpImpl *p = (MppDumpImpl *)*info;

        MPP_FCLOSE(p->fp_in);
        MPP_FCLOSE(p->fp_out);
        MPP_FCLOSE(p->fp_ops);
        MPP_FREE(p->fp_buf);

        if (p->lock) {
            delete p->lock;
            p->lock = NULL;
        }
    }

    return MPP_OK;
}